

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Digraph.h
# Opt level: O0

CDAG * degenOrdered(CDAG *__return_storage_ptr__,CGraph *g)

{
  bool *pbVar1;
  long lVar2;
  long lVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  VertexIdx *__first;
  ulong uVar13;
  EdgeIdx *pEVar14;
  VertexIdx *pVVar15;
  long *__last;
  long lVar16;
  long local_128;
  EdgeIdx j_1;
  VertexIdx i_4;
  VertexIdx dest;
  VertexIdx i_3;
  VertexIdx j;
  VertexIdx time;
  VertexIdx next;
  VertexIdx swap;
  VertexIdx nbr;
  VertexIdx to_remove;
  VertexIdx i_2;
  VertexIdx running_deg;
  VertexIdx current_deg;
  VertexIdx deg;
  VertexIdx min_deg;
  VertexIdx current_vert;
  VertexIdx i_1;
  long local_98;
  VertexIdx i;
  bool *is_removed;
  VertexIdx *deg_ptrs;
  VertexIdx *vert_ptrs;
  VertexIdx *degrees;
  VertexIdx *verts_by_deg;
  VertexIdx *removal_time;
  EdgeIdx incur;
  EdgeIdx outcur;
  CGraph indag;
  CGraph outdag;
  CGraph *g_local;
  
  indag.nbors = (VertexIdx *)g->nVertices;
  outdag.nVertices = 0;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = g->nVertices + 1;
  uVar13 = SUB168(auVar4 * ZEXT816(8),0);
  if (SUB168(auVar4 * ZEXT816(8),8) != 0) {
    uVar13 = 0xffffffffffffffff;
  }
  pEVar14 = (EdgeIdx *)operator_new__(uVar13);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = g->nEdges + 1;
  uVar13 = SUB168(auVar5 * ZEXT816(8),0);
  if (SUB168(auVar5 * ZEXT816(8),8) != 0) {
    uVar13 = 0xffffffffffffffff;
  }
  pVVar15 = (VertexIdx *)operator_new__(uVar13);
  outcur = g->nVertices;
  indag.nVertices = 0;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = g->nVertices + 1;
  uVar13 = SUB168(auVar6 * ZEXT816(8),0);
  if (SUB168(auVar6 * ZEXT816(8),8) != 0) {
    uVar13 = 0xffffffffffffffff;
  }
  indag.nEdges = (EdgeIdx)operator_new__(uVar13);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = g->nEdges + 1;
  uVar13 = SUB168(auVar7 * ZEXT816(8),0);
  if (SUB168(auVar7 * ZEXT816(8),8) != 0) {
    uVar13 = 0xffffffffffffffff;
  }
  indag.offsets = (EdgeIdx *)operator_new__(uVar13);
  incur = 0;
  removal_time = (VertexIdx *)0x0;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = g->nVertices;
  uVar13 = SUB168(auVar8 * ZEXT816(8),0);
  if (SUB168(auVar8 * ZEXT816(8),8) != 0) {
    uVar13 = 0xffffffffffffffff;
  }
  verts_by_deg = (VertexIdx *)operator_new__(uVar13);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = g->nVertices;
  uVar13 = SUB168(auVar9 * ZEXT816(8),0);
  if (SUB168(auVar9 * ZEXT816(8),8) != 0) {
    uVar13 = 0xffffffffffffffff;
  }
  degrees = (VertexIdx *)operator_new__(uVar13);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = g->nVertices;
  uVar13 = SUB168(auVar10 * ZEXT816(8),0);
  if (SUB168(auVar10 * ZEXT816(8),8) != 0) {
    uVar13 = 0xffffffffffffffff;
  }
  vert_ptrs = (VertexIdx *)operator_new__(uVar13);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = g->nVertices;
  uVar13 = SUB168(auVar11 * ZEXT816(8),0);
  if (SUB168(auVar11 * ZEXT816(8),8) != 0) {
    uVar13 = 0xffffffffffffffff;
  }
  deg_ptrs = (VertexIdx *)operator_new__(uVar13);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = g->nVertices + 1;
  uVar13 = SUB168(auVar12 * ZEXT816(8),0);
  if (SUB168(auVar12 * ZEXT816(8),8) != 0) {
    uVar13 = 0xffffffffffffffff;
  }
  is_removed = (bool *)operator_new__(uVar13);
  i = (VertexIdx)operator_new__(g->nVertices);
  __first = degrees;
  for (local_98 = 0; local_98 < g->nVertices; local_98 = local_98 + 1) {
    degrees[local_98] = local_98;
    *(undefined1 *)(i + local_98) = 0;
    vert_ptrs[local_98] = g->offsets[local_98 + 1] - g->offsets[local_98];
  }
  __last = degrees + g->nVertices;
  DegreeComp::DegreeComp((DegreeComp *)&i_1,g);
  std::sort<long*,DegreeComp>(__first,__last,(DegreeComp)i_1);
  for (current_vert = 0; current_vert < g->nVertices; current_vert = current_vert + 1) {
    deg_ptrs[degrees[current_vert]] = current_vert;
  }
  deg = g->offsets[*degrees + 1] - g->offsets[*degrees];
  for (current_deg = 0; current_deg < g->nVertices; current_deg = current_deg + 1) {
    pbVar1 = is_removed + current_deg * 8;
    pbVar1[0] = true;
    pbVar1[1] = true;
    pbVar1[2] = true;
    pbVar1[3] = true;
    pbVar1[4] = true;
    pbVar1[5] = true;
    pbVar1[6] = true;
    pbVar1[7] = true;
  }
  pbVar1 = is_removed + deg * 8;
  pbVar1[0] = false;
  pbVar1[1] = false;
  pbVar1[2] = false;
  pbVar1[3] = false;
  pbVar1[4] = false;
  pbVar1[5] = false;
  pbVar1[6] = false;
  pbVar1[7] = false;
  i_2 = deg;
  for (to_remove = 0; to_remove < g->nVertices; to_remove = to_remove + 1) {
    lVar16 = g->offsets[degrees[to_remove] + 1] - g->offsets[degrees[to_remove]];
    if (lVar16 != i_2) {
      *(VertexIdx *)(is_removed + lVar16 * 8) = to_remove;
      i_2 = lVar16;
    }
  }
  j = 0;
  do {
    if (g->nVertices <= j) {
      dest = 0;
      while( true ) {
        if (g->nVertices <= dest) {
          *pEVar14 = 0;
          *(undefined8 *)indag.nEdges = 0;
          incur = 0;
          removal_time = (VertexIdx *)0x0;
          for (j_1 = 0; j_1 < g->nVertices; j_1 = j_1 + 1) {
            for (local_128 = g->offsets[j_1]; local_128 < g->offsets[j_1 + 1];
                local_128 = local_128 + 1) {
              lVar16 = g->nbors[local_128];
              if (verts_by_deg[j_1] < verts_by_deg[lVar16]) {
                pVVar15[incur] = lVar16;
                incur = incur + 1;
                outdag.nVertices = outdag.nVertices + 1;
              }
              else {
                indag.offsets[(long)removal_time] = lVar16;
                removal_time = (VertexIdx *)((long)removal_time + 1);
                indag.nVertices = indag.nVertices + 1;
              }
            }
            pEVar14[j_1 + 1] = incur;
            *(VertexIdx **)(indag.nEdges + 8 + j_1 * 8) = removal_time;
          }
          (__return_storage_ptr__->outlist).nVertices = (VertexIdx)indag.nbors;
          (__return_storage_ptr__->outlist).nEdges = outdag.nVertices;
          (__return_storage_ptr__->outlist).offsets = pEVar14;
          (__return_storage_ptr__->outlist).nbors = pVVar15;
          (__return_storage_ptr__->inlist).nVertices = outcur;
          (__return_storage_ptr__->inlist).nEdges = indag.nVertices;
          (__return_storage_ptr__->inlist).offsets = (EdgeIdx *)indag.nEdges;
          (__return_storage_ptr__->inlist).nbors = indag.offsets;
          if (verts_by_deg != (VertexIdx *)0x0) {
            operator_delete__(verts_by_deg);
          }
          if (degrees != (VertexIdx *)0x0) {
            operator_delete__(degrees);
          }
          if (vert_ptrs != (VertexIdx *)0x0) {
            operator_delete__(vert_ptrs);
          }
          if (deg_ptrs != (VertexIdx *)0x0) {
            operator_delete__(deg_ptrs);
          }
          if (is_removed != (bool *)0x0) {
            operator_delete__(is_removed);
          }
          if (i != 0) {
            operator_delete__((void *)i);
          }
          return __return_storage_ptr__;
        }
        if ((*(byte *)(i + dest) & 1) == 0) break;
        dest = dest + 1;
      }
      printf("Error in degeneracy removal. Vertex %lld not removed\n",dest);
      exit(1);
    }
    lVar16 = degrees[*(long *)(is_removed + deg * 8)];
    verts_by_deg[lVar16] = j;
    *(undefined1 *)(i + lVar16) = 1;
    lVar2 = degrees[*(long *)(is_removed + deg * 8) + 1];
    degrees[*(long *)(is_removed + deg * 8)] = -1;
    if (vert_ptrs[lVar2] == vert_ptrs[lVar16]) {
      *(long *)(is_removed + deg * 8) = *(long *)(is_removed + deg * 8) + 1;
    }
    else {
      pbVar1 = is_removed + deg * 8;
      pbVar1[0] = true;
      pbVar1[1] = true;
      pbVar1[2] = true;
      pbVar1[3] = true;
      pbVar1[4] = true;
      pbVar1[5] = true;
      pbVar1[6] = true;
      pbVar1[7] = true;
      deg = vert_ptrs[lVar2];
    }
    for (i_3 = g->offsets[lVar16]; i_3 < g->offsets[lVar16 + 1]; i_3 = i_3 + 1) {
      lVar2 = g->nbors[i_3];
      if ((*(byte *)(i + lVar2) & 1) == 0) {
        lVar3 = degrees[*(long *)(is_removed + vert_ptrs[lVar2] * 8)];
        if (lVar3 == -1) {
          printf("Error in degeneracy removal. Swapping with removed vertex\n nbr = %lld, deg_ptrs[degrees[nbr]] = %lld"
                 ,lVar2,*(undefined8 *)(is_removed + vert_ptrs[lVar2] * 8));
          exit(1);
        }
        degrees[*(long *)(is_removed + vert_ptrs[lVar2] * 8)] = lVar2;
        degrees[deg_ptrs[lVar2]] = lVar3;
        deg_ptrs[lVar3] = deg_ptrs[lVar2];
        deg_ptrs[lVar2] = *(VertexIdx *)(is_removed + vert_ptrs[lVar2] * 8);
        if (vert_ptrs[degrees[*(long *)(is_removed + vert_ptrs[lVar2] * 8) + 1]] == vert_ptrs[lVar2]
           ) {
          *(long *)(is_removed + vert_ptrs[lVar2] * 8) =
               *(long *)(is_removed + vert_ptrs[lVar2] * 8) + 1;
        }
        else {
          pbVar1 = is_removed + vert_ptrs[lVar2] * 8;
          pbVar1[0] = true;
          pbVar1[1] = true;
          pbVar1[2] = true;
          pbVar1[3] = true;
          pbVar1[4] = true;
          pbVar1[5] = true;
          pbVar1[6] = true;
          pbVar1[7] = true;
        }
        vert_ptrs[lVar2] = vert_ptrs[lVar2] + -1;
        if (*(long *)(is_removed + vert_ptrs[lVar2] * 8) == -1) {
          *(VertexIdx *)(is_removed + vert_ptrs[lVar2] * 8) = deg_ptrs[lVar2];
        }
        if (vert_ptrs[lVar2] < deg) {
          deg = vert_ptrs[lVar2];
        }
      }
    }
    j = j + 1;
  } while( true );
}

Assistant:

CDAG degenOrdered(CGraph *g) {
    CDAG ret;     // CDAG to be returned
    CGraph outdag = {g->nVertices, 0, new EdgeIdx[g->nVertices + 1],
                     new VertexIdx[g->nEdges + 1]};  // Initialize DAG of out-edges
    CGraph indag = {g->nVertices, 0, new EdgeIdx[g->nVertices + 1],
                    new VertexIdx[g->nEdges + 1]};   // Initialize DAG of in-edges
    EdgeIdx outcur = 0;
    EdgeIdx incur = 0;
    VertexIdx *removal_time = new VertexIdx[g->nVertices]; // array of removal times
    VertexIdx *verts_by_deg = new VertexIdx[g->nVertices]; // array of vertices, sorted by current degree
    VertexIdx *degrees = new VertexIdx[g->nVertices]; // array of degrees
    VertexIdx *vert_ptrs = new VertexIdx[g->nVertices]; // array of vertex pointers, that point into verts_by_deg
    VertexIdx *deg_ptrs = new VertexIdx[g->nVertices +
                                        1]; // array of degree pointers, pointing into verts_by_deg. deg_ptrs[deg] will point to the first vertex in vert_by_deg with degree deg
    bool *is_removed = new bool[g->nVertices]; // to keep track of whether vertex was removed

    //first, set up a sorted list of vertices by degree
    for (VertexIdx i = 0; i < g->nVertices; i++) // looping over vertices
    {
        verts_by_deg[i] = i; //initializing verts_by_deg to store all vertex labels
        is_removed[i] = false; //intiailizing is_removed to all false
        degrees[i] = g->offsets[i + 1] - g->offsets[i]; // storing the degree of vertex i
    }

    std::sort(verts_by_deg, verts_by_deg + g->nVertices, DegreeComp(g)); // sort all the vertices by degree
    // set up vertex pointers
    for (VertexIdx i = 0; i < g->nVertices; i++) //looping over verts_by_deg
        vert_ptrs[verts_by_deg[i]] = i; // the vertex verts_by_deg[i] is a position i

    //now set up degree pointers
    VertexIdx current_vert = verts_by_deg[0]; //initialize current vertex to smallest degree vertex
    VertexIdx min_deg =
            g->offsets[current_vert + 1] - g->offsets[current_vert]; //initialize running degree to lowest degree
    for (VertexIdx deg = 0; deg < g->nVertices; deg++) //looping over degrees
        deg_ptrs[deg] = -1; // initialize these pointers to -1
    deg_ptrs[min_deg] = 0; // initialize the pointer for minimum degree to beginning on array

    VertexIdx current_deg, running_deg; // we will need this variables while looping
    running_deg = min_deg; //initialize the running degree to the minimum degree
    for (VertexIdx i = 0; i < g->nVertices; i++) //looping over vertices
    {
        current_vert = verts_by_deg[i]; // the ith vertex in sorted list by degree
        current_deg = g->offsets[current_vert + 1] - g->offsets[current_vert]; // get degree of current vertex
        if (current_deg == running_deg) // the current degree is same as running degree, so we move to next vertex
            continue;
        // current_deg is larger, so we need to set pointer in deg_ptrs
        deg_ptrs[current_deg] = i; // the first vertex with current_deg is at location i
        running_deg = current_deg; //update the running degree
    }

    // at this point, we have set up verts_by_deg and deg_ptrs. Now we begin the actual removal of vertices
    VertexIdx to_remove, nbr, swap, next; // convenient variables used in next loop
    for (VertexIdx time = 0;
         time < g->nVertices; time++) // a loop to remove all vertices, with loop variable being the "time"
    {
        to_remove = verts_by_deg[deg_ptrs[min_deg]]; // remove the vertex of minimum degree
        removal_time[to_remove] = time; // set removal time of vertex
        is_removed[to_remove] = true; // remove this vertex

//         printf("Removed %lld, min deg = %lld, position = %lld\n",to_remove,min_deg,deg_ptrs[min_deg]); //(for debug)
//         if (time == g->nVertices-1) // last vertex removed
//             break; // just exit. This is to prevent possible pointer/off-by-1 issues in the remaining code

        next = verts_by_deg[deg_ptrs[min_deg] + 1]; // the next vertex in the current ordering of degree
        verts_by_deg[deg_ptrs[min_deg]] = -1; // remove vertex from array
        if (degrees[next] != degrees[to_remove]) // next has higher degree
        {
            deg_ptrs[min_deg] = -1; // there is no vertex of degree min_deg
            min_deg = degrees[next]; //update minimum degree
        } else //next vertex has same degree, so only need to increment pointer
            deg_ptrs[min_deg]++; // increment degree pointer for minimum degree, since first vertex is removed

        for (VertexIdx j = g->offsets[to_remove];
             j < g->offsets[to_remove + 1]; j++) // loop over neighbors of removed vertex
        {
            nbr = g->nbors[j]; // looking at the neighbor
            if (is_removed[nbr]) // if neighbor is removed, move to next neighbor
                continue;
//             for (VertexIdx ind=0; ind < g->nVertices; ind++) FOR DEBUG
//                 printf("%lld ",verts_by_deg[ind]);
//             printf("Moving %lld from %lld to %lld\n",nbr,vert_ptrs[nbr],deg_ptrs[degrees[nbr]]);

            swap = verts_by_deg[deg_ptrs[degrees[nbr]]]; //vertex to be swapped with nbr
            if (swap == -1) // some problem, swapping with deleted vertex
            {
                printf("Error in degeneracy removal. Swapping with removed vertex\n nbr = %lld, deg_ptrs[degrees[nbr]] = %lld",
                       nbr, deg_ptrs[degrees[nbr]]);
                exit(EXIT_FAILURE);
            }
            verts_by_deg[deg_ptrs[degrees[nbr]]] = nbr; //place nbr at beginning of list of vertices of its degree
            verts_by_deg[vert_ptrs[nbr]] = swap; //place swapped vertex at location of nbr

            vert_ptrs[swap] = vert_ptrs[nbr]; // update position of swapped vertex
            vert_ptrs[nbr] = deg_ptrs[degrees[nbr]]; // update position of nbr

            if (degrees[verts_by_deg[deg_ptrs[degrees[nbr]] + 1]] ==
                degrees[nbr]) // if next vertex in verts_by_deg after nbr has same degree
                deg_ptrs[degrees[nbr]]++; //increment degree pointer for vertices of degree of nbr, since nbr's degree will be decremented
            else // next vertex has higher degree
                deg_ptrs[degrees[nbr]] = -1; // no more vertices of that degree
            degrees[nbr]--; //decrement degree of neighbor
            if (deg_ptrs[degrees[nbr]] == -1) // if there was no vertex with the same degree as nbr
                deg_ptrs[degrees[nbr]] = vert_ptrs[nbr]; // set the degree pointer to current position of nbr

            if (min_deg > degrees[nbr]) // update minimum degree, if needed
                min_deg = degrees[nbr];
        }
    }

    //sanity check; make sure all vertices are removed
    for (VertexIdx i = 0; i < g->nVertices; i++) {
        if (!is_removed[i]) // i was not removed
        {
            printf("Error in degeneracy removal. Vertex %lld not removed\n", i);
            exit(EXIT_FAILURE);
        }
    }

    //now we build the DAG
    outdag.offsets[0] = 0;
    indag.offsets[0] = 0;
    VertexIdx dest;
    outcur = 0;
    incur = 0;

    for (VertexIdx i = 0; i < g->nVertices; ++i)   // Looping over all vertices in g
    {
        for (EdgeIdx j = g->offsets[i]; j < g->offsets[i + 1]; ++j)   // Looping over neighbors of i in g
        {
            dest = g->nbors[j];     // We are now looking at edge (i,dest)

            //We now orient the edge depending of removal times
            // In the output, the g-edge (i,dest) is either pointing to dest (in if condition) or pointing to i (in else condition).

            if (removal_time[i] < removal_time[dest]) // i was removed before dest
            {
                outdag.nbors[outcur] = dest;   // We want point edge from i to dest. So this directed edge is added to outdag.
                ++outcur;                      // Increment pointer in outdag.nbors and the number of edges in outdag.
                ++outdag.nEdges;
            } else {
                indag.nbors[incur] = dest;     // We point edge from dest to i. So this edge goes into indag.
                ++incur;                       // Pointer and number of edges incremented
                ++indag.nEdges;
            }
        }
        outdag.offsets[i +
                       1] = outcur;         // We have finished all edges incident to i, so we can update offsets in DAGs.
        indag.offsets[i + 1] = incur;
    }

    ret.outlist = outdag;
    ret.inlist = indag;

    // free memory
    delete[] removal_time;
    delete[] verts_by_deg;
    delete[] degrees;
    delete[] vert_ptrs;
    delete[] deg_ptrs;
    delete[] is_removed;

    return ret;
}